

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O0

byte getBinaryLengthByValue(int value)

{
  int local_14;
  byte local_d;
  int local_c;
  byte result;
  int value_local;
  
  local_14 = value;
  if (value < 0) {
    local_14 = -value;
  }
  local_d = '\0';
  for (local_c = local_14; local_c != 0; local_c = local_c >> 1) {
    local_d = local_d + '\x01';
  }
  return local_d;
}

Assistant:

byte getBinaryLengthByValue(int value) {
    value = value < 0 ? (-value) : value;
    byte result = 0;
    while(value != 0) {
        value = value >> 1;
        result = result + 1;
    }
    return result;    
}